

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fftrec(char *card,int *status)

{
  size_t sVar1;
  char local_88 [8];
  char msg [81];
  size_t maxchr;
  size_t ii;
  int *status_local;
  char *card_local;
  
  if (*status < 1) {
    register0x00000000 = strlen(card);
    for (maxchr = 8; maxchr < register0x00000000; maxchr = maxchr + 1) {
      if ((card[maxchr] < ' ') || ('~' < card[maxchr])) {
        snprintf(local_88,0x51,"Character %d in this keyword is illegal. Hex Value = %X",
                 (ulong)((int)maxchr + 1),(ulong)(uint)(int)card[maxchr]);
        if (card[maxchr] == '\0') {
          sVar1 = strlen(local_88);
          strncat(local_88," (NULL char.)",0x50 - sVar1);
        }
        else if (card[maxchr] == '\t') {
          sVar1 = strlen(local_88);
          strncat(local_88," (TAB char.)",0x50 - sVar1);
        }
        else if (card[maxchr] == '\n') {
          sVar1 = strlen(local_88);
          strncat(local_88," (Line Feed char.)",0x50 - sVar1);
        }
        else if (card[maxchr] == '\v') {
          sVar1 = strlen(local_88);
          strncat(local_88," (Vertical Tab)",0x50 - sVar1);
        }
        else if (card[maxchr] == '\f') {
          sVar1 = strlen(local_88);
          strncat(local_88," (Form Feed char.)",0x50 - sVar1);
        }
        else if (card[maxchr] == '\r') {
          sVar1 = strlen(local_88);
          strncat(local_88," (Carriage Return)",0x50 - sVar1);
        }
        else if (card[maxchr] == '\x1b') {
          sVar1 = strlen(local_88);
          strncat(local_88," (Escape char.)",0x50 - sVar1);
        }
        else if (card[maxchr] == '\x7f') {
          sVar1 = strlen(local_88);
          strncat(local_88," (Delete char.)",0x50 - sVar1);
        }
        ffpmsg(local_88);
        strncpy(local_88,card,0x50);
        msg[0x48] = '\0';
        ffpmsg(local_88);
        *status = 0xcf;
        return 0xcf;
      }
    }
    card_local._4_4_ = *status;
  }
  else {
    card_local._4_4_ = *status;
  }
  return card_local._4_4_;
}

Assistant:

int fftrec(char *card,       /* I -  keyword card to test */
           int *status)      /* IO - error status */
/*
  Test that the keyword card conforms to the FITS standard.  Must contain
  only printable ASCII characters;
*/
{
    size_t ii, maxchr;
    char msg[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    maxchr = strlen(card);

    for (ii = 8; ii < maxchr; ii++)
    {
        if (card[ii] < 32 || card[ii] > 126)
        {
            snprintf(msg, FLEN_ERRMSG, 
           "Character %d in this keyword is illegal. Hex Value = %X",
              (int) (ii+1), (int) card[ii] );

            if (card[ii] == 0)
	        strncat(msg, " (NULL char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 9)
	        strncat(msg, " (TAB char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 10)
	        strncat(msg, " (Line Feed char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 11)
	        strncat(msg, " (Vertical Tab)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 12)
	        strncat(msg, " (Form Feed char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 13)
	        strncat(msg, " (Carriage Return)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 27)
	        strncat(msg, " (Escape char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 127)
	        strncat(msg, " (Delete char.)",FLEN_ERRMSG-strlen(msg)-1);

            ffpmsg(msg);

            strncpy(msg, card, 80);
            msg[80] = '\0';
            ffpmsg(msg);
            return(*status = BAD_KEYCHAR);        
        }
    }
    return(*status);        
}